

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O1

_Bool av1_compute_global_motion_disflow
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImagePyramid *pyr;
  CornerList *corners;
  ImagePyramid *pyr_00;
  PyramidLayer *pPVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  bool bVar8;
  _Bool _Var9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined8 *memblk;
  void *pvVar14;
  Correspondence *matched_points;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  double *pdVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  double *pdVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  ulong local_c8;
  double local_a8 [4];
  double *local_88;
  ImagePyramid *local_80;
  double *local_78;
  double *local_70;
  long local_68;
  double flow_u;
  void *local_58;
  MotionModel *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pyr = src->y_pyramid;
  corners = src->corners;
  pyr_00 = ref->y_pyramid;
  local_50 = motion_models;
  uVar10 = aom_compute_pyramid(src,bit_depth,0xc,pyr);
  local_80 = pyr_00;
  iVar11 = aom_compute_pyramid(ref,bit_depth,0xc,pyr_00);
  if ((((int)uVar10 < 0) || (iVar11 < 0)) ||
     (_Var9 = av1_compute_corner_list(src,bit_depth,downsample_level,corners), !_Var9)) {
LAB_008deaf8:
    *mem_alloc_failed = true;
    return false;
  }
  iVar11 = pyr->layers->width;
  iVar19 = pyr->layers->height;
  memblk = (undefined8 *)aom_malloc(0x28);
  if (memblk == (undefined8 *)0x0) {
    memblk = (undefined8 *)0x0;
  }
  else {
    iVar11 = iVar11 >> 3;
    *(int *)(memblk + 3) = iVar11;
    iVar19 = iVar19 >> 3;
    *(int *)((long)memblk + 0x1c) = iVar19;
    iVar11 = iVar11 + 4;
    *(int *)(memblk + 4) = iVar11;
    lVar20 = (long)(iVar19 + 4) * (long)iVar11;
    pvVar14 = aom_calloc(lVar20 * 2,8);
    *memblk = pvVar14;
    if (pvVar14 == (void *)0x0) {
      aom_free(memblk);
      memblk = (undefined8 *)0x0;
    }
    else {
      memblk[1] = (long)pvVar14 + (long)*(int *)(memblk + 4) * 0x10 + 0x10;
      memblk[2] = (long)pvVar14 + lVar20 * 8 + (long)*(int *)(memblk + 4) * 0x10 + 0x10;
    }
  }
  if (memblk == (undefined8 *)0x0) goto LAB_008deaf8;
  pdVar21 = (double *)memblk[1];
  pdVar26 = (double *)memblk[2];
  if ((int)uVar10 < 2) {
    local_88 = (double *)0x0;
    pvVar14 = (void *)0x0;
  }
  else {
    pvVar14 = aom_malloc((long)*(int *)(memblk + 4) * ((long)(pyr->layers[1].height >> 3) + 4) * 8);
    if (pvVar14 == (void *)0x0) {
      bVar8 = false;
      goto LAB_008dee2d;
    }
    local_88 = (double *)((long)*(int *)(memblk + 4) * 0x10 + (long)pvVar14);
  }
  bVar8 = true;
  if (1 < (int)uVar10) {
    uVar16 = (ulong)uVar10;
    local_78 = pdVar26;
    local_70 = pdVar21;
    local_58 = pvVar14;
    do {
      pPVar5 = pyr->layers;
      iVar11 = pPVar5[uVar16 - 1].width;
      iVar19 = pPVar5[uVar16 - 1].height;
      uVar10 = iVar11 >> 3;
      uVar22 = iVar19 >> 3;
      local_68 = (long)*(int *)(memblk + 4);
      local_48 = uVar16;
      if (0 < (int)uVar22) {
        iVar1 = pPVar5[uVar16 - 1].stride;
        puVar6 = pPVar5[uVar16 - 1].buffer;
        puVar7 = local_80->layers[uVar16 - 1].buffer;
        local_38 = (ulong)uVar22;
        local_40 = local_68 * 8;
        local_c8 = 0;
        pdVar21 = local_78;
        pdVar26 = local_70;
        do {
          if (0 < (int)uVar10) {
            lVar20 = 0;
            do {
              (*aom_compute_flow_at_point)
                        (puVar6,puVar7,(int)lVar20,(int)local_c8 * 8,iVar11,iVar19,iVar1,
                         (double *)((long)pdVar26 + lVar20),(double *)((long)pdVar21 + lVar20));
              lVar20 = lVar20 + 8;
            } while ((ulong)uVar10 << 3 != lVar20);
          }
          local_c8 = local_c8 + 1;
          pdVar21 = (double *)((long)pdVar21 + local_40);
          pdVar26 = (double *)((long)pdVar26 + local_40);
        } while (local_c8 != local_38);
      }
      pdVar21 = local_70;
      iVar11 = (int)local_68;
      fill_flow_field_borders(local_70,uVar10,uVar22,iVar11);
      pdVar17 = local_78;
      fill_flow_field_borders(local_78,uVar10,uVar22,iVar11);
      pdVar26 = local_88;
      uVar16 = (long)(int)uVar22 * 2;
      lVar20 = (long)*(int *)(memblk + 4);
      upscale_flow_component(pdVar21,uVar10,uVar22,iVar11,local_88);
      upscale_flow_component(pdVar17,uVar10,uVar22,iVar11,pdVar26);
      iVar11 = pyr->layers[local_48 - 2].height;
      uVar12 = pyr->layers[local_48 - 2].width >> 3;
      if ((0 < (int)uVar22) && ((int)(uVar10 * 2) < (int)uVar12)) {
        uVar24 = uVar16 & 0xffffffff;
        lVar18 = (long)(int)(uVar10 * 2) << 3;
        do {
          *(undefined8 *)((long)pdVar21 + lVar18) = *(undefined8 *)((long)pdVar21 + lVar18 + -8);
          *(undefined8 *)((long)pdVar17 + lVar18) = *(undefined8 *)((long)pdVar17 + lVar18 + -8);
          lVar18 = lVar18 + lVar20 * 8;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      if ((0 < (int)uVar12) && ((int)uVar16 < iVar11 >> 3)) {
        uVar24 = (ulong)uVar12;
        pdVar17 = pdVar17 + uVar16 * lVar20;
        pdVar21 = pdVar21 + uVar16 * lVar20;
        do {
          *pdVar21 = pdVar21[-lVar20];
          *pdVar17 = pdVar17[-lVar20];
          pdVar17 = pdVar17 + 1;
          pdVar21 = pdVar21 + 1;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      uVar16 = local_48 - 1;
    } while (2 < (long)local_48);
    bVar8 = true;
    pvVar14 = local_58;
  }
LAB_008dee2d:
  aom_free(pvVar14);
  if ((bVar8) &&
     (matched_points = (Correspondence *)aom_malloc((long)corners->num_corners << 5),
     matched_points != (Correspondence *)0x0)) {
    if (corners->num_corners < 1) {
      iVar11 = 0;
    }
    else {
      iVar19 = *(int *)(memblk + 3);
      iVar1 = *(int *)((long)memblk + 0x1c);
      iVar2 = *(int *)(memblk + 4);
      lVar20 = (long)iVar2;
      lVar18 = 0;
      iVar11 = 0;
      do {
        iVar3 = corners->corners[lVar18 * 2];
        uVar10 = iVar3 - 3;
        iVar13 = (int)uVar10 >> 3;
        if ((0 < iVar13) && (iVar13 + 2 < iVar19)) {
          iVar4 = corners->corners[lVar18 * 2 + 1];
          uVar22 = iVar4 - 3;
          iVar23 = (int)uVar22 >> 3;
          if ((0 < iVar23) && (iVar23 + 2 < iVar1)) {
            dVar31 = (double)(uVar10 & 7) * 0.125;
            dVar27 = (double)(uVar22 & 7) * 0.125;
            dVar28 = dVar31 * dVar31;
            dVar33 = dVar31 * dVar28;
            dVar29 = dVar33 * -0.5 + dVar31 * -0.5 + dVar28;
            dVar30 = dVar33 * 1.5 + dVar28 * -2.5 + 1.0;
            dVar32 = dVar33 * -1.5 + dVar31 * 0.5 + dVar28 + dVar28;
            dVar28 = dVar28 * -0.5 + dVar33 * 0.5;
            dVar31 = dVar27 * dVar27;
            lVar15 = (long)(iVar23 * iVar2 + iVar13);
            pdVar21 = (double *)(memblk[1] + lVar20 * -8 + lVar15 * 8);
            lVar25 = 0;
            do {
              local_a8[lVar25] =
                   pdVar21[2] * dVar28 +
                   pdVar21[1] * dVar32 + pdVar21[-1] * dVar29 + *pdVar21 * dVar30;
              lVar25 = lVar25 + 1;
              pdVar21 = pdVar21 + lVar20;
            } while (lVar25 != 4);
            dVar33 = dVar27 * dVar31;
            dVar34 = dVar33 * -0.5 + dVar27 * -0.5 + dVar31;
            dVar35 = dVar33 * 1.5 + dVar31 * -2.5 + 1.0;
            dVar27 = dVar33 * -1.5 + dVar27 * 0.5 + dVar31 + dVar31;
            dVar31 = dVar31 * -0.5 + dVar33 * 0.5;
            flow_u = local_a8[3] * dVar31 +
                     local_a8[2] * dVar27 + local_a8[0] * dVar34 + local_a8[1] * dVar35;
            pdVar21 = (double *)(memblk[2] + lVar20 * -8 + lVar15 * 8);
            lVar15 = 0;
            do {
              local_a8[lVar15] =
                   pdVar21[2] * dVar28 +
                   pdVar21[1] * dVar32 + pdVar21[-1] * dVar29 + *pdVar21 * dVar30;
              lVar15 = lVar15 + 1;
              pdVar21 = pdVar21 + lVar20;
            } while (lVar15 != 4);
            local_a8[0] = dVar31 * local_a8[3] +
                          dVar27 * local_a8[2] + dVar34 * local_a8[0] + dVar35 * local_a8[1];
            pPVar5 = pyr->layers;
            (*aom_compute_flow_at_point)
                      (pPVar5->buffer,local_80->layers->buffer,uVar10,uVar22,pPVar5->width,
                       pPVar5->height,pPVar5->stride,&flow_u,local_a8);
            dVar27 = (double)iVar3;
            matched_points[iVar11].x = dVar27;
            dVar28 = (double)iVar4;
            matched_points[iVar11].y = dVar28;
            matched_points[iVar11].rx = dVar27 + flow_u;
            matched_points[iVar11].ry = dVar28 + local_a8[0];
            iVar11 = iVar11 + 1;
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < corners->num_corners);
    }
    _Var9 = ransac(matched_points,iVar11,type,local_50,num_motion_models,mem_alloc_failed);
    aom_free(matched_points);
    aom_free((void *)*memblk);
    aom_free(memblk);
    return _Var9;
  }
  *mem_alloc_failed = true;
  aom_free((void *)*memblk);
  aom_free(memblk);
  return false;
}

Assistant:

bool av1_compute_global_motion_disflow(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  // Precompute information we will need about each frame
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;

  const int src_layers =
      aom_compute_pyramid(src, bit_depth, DISFLOW_PYRAMID_LEVELS, src_pyramid);
  const int ref_layers =
      aom_compute_pyramid(ref, bit_depth, DISFLOW_PYRAMID_LEVELS, ref_pyramid);

  if (src_layers < 0 || ref_layers < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  assert(src_layers == ref_layers);

  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);

  FlowField *flow = alloc_flow_field(src_width, src_height);
  if (!flow) {
    *mem_alloc_failed = true;
    return false;
  }

  if (!compute_flow_field(src_pyramid, ref_pyramid, src_layers, flow)) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  // find correspondences between the two images using the flow field
  Correspondence *correspondences =
      aom_malloc(src_corners->num_corners * sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  const int num_correspondences = determine_disflow_correspondence(
      src_pyramid, ref_pyramid, src_corners, flow, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  free_flow_field(flow);
  return result;
}